

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int file_close(file_t *file)

{
  int iVar1;
  int iVar2;
  
  if (file != (file_t *)0x0) {
    iVar2 = 1;
    if (file->fd != 0) {
      iVar1 = close(file->fd);
      if (iVar1 < 0) {
        perror("close");
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  __assert_fail("file != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/file.c",0x7b,
                "int file_close(file_t *)");
}

Assistant:

int file_close(file_t *file) {
  assert(file != NULL);

  if (file->fd != STDIN_FILENO) {
    if (close(file->fd) < 0) {
      perror("close");
      return 0;
    }
  }

  return 1;
}